

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O2

void display_scrolling(menu_conflict *menu,int cursor,int *top,region_conflict *loc)

{
  wchar_t x;
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  wchar_t y;
  int iVar5;
  int iVar6;
  int in_stack_ffffffffffffffa8;
  
  x = loc->col;
  iVar1 = loc->row;
  iVar6 = loc->page_rows;
  piVar4 = &menu->filter_count;
  if (menu->filter_list == (int *)0x0) {
    piVar4 = &menu->count;
  }
  iVar5 = *top;
  iVar3 = cursor + -1;
  if (iVar5 < 1) {
    iVar3 = iVar5;
  }
  iVar2 = *piVar4;
  if (iVar5 < cursor) {
    iVar3 = iVar5;
  }
  iVar5 = (cursor - iVar6) + 2;
  if (cursor < iVar6 + iVar3 + -1) {
    iVar5 = iVar3;
  }
  iVar3 = iVar2 - iVar6;
  if (iVar5 < iVar3) {
    iVar3 = iVar5;
  }
  iVar5 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  *top = iVar3;
  if (iVar6 < 1) {
    iVar6 = iVar5;
  }
  for (; iVar6 != iVar5; iVar5 = iVar5 + 1) {
    y = iVar1 + iVar5;
    Term_erase(x,y,loc->width);
    if (iVar5 < iVar2) {
      display_menu_row(menu,*top + iVar5,(uint)(iVar5 == cursor - *top),SUB41(y,0),x,loc->width,
                       in_stack_ffffffffffffffa8);
    }
  }
  if (-1 < menu->cursor) {
    Term_gotoxy(x + menu->cursor_x_offset,(iVar1 + cursor) - *top);
    return;
  }
  return;
}

Assistant:

static void display_scrolling(struct menu *menu, int cursor, int *top, region *loc)
{
	int col = loc->col;
	int row = loc->row;
	int rows_per_page = loc->page_rows;
	int n = menu->filter_list ? menu->filter_count : menu->count;
	int i;

	/* Keep a certain distance from the top when possible */
	if ((cursor <= *top) && (*top > 0))
		*top = cursor - 1;

	/* Keep a certain distance from the bottom when possible */
	if (cursor >= *top + (rows_per_page - 1))
		*top = cursor - (rows_per_page - 1) + 1;

	/* Limit the top to legal places */
	*top = MIN(*top, n - rows_per_page);
	*top = MAX(*top, 0);

	for (i = 0; i < rows_per_page; i++) {
		/* Blank all lines */
		Term_erase(col, row + i, loc->width);
		if (i < n) {
			/* Redraw the line if it's within the number of menu items */
			bool is_curs = (i == cursor - *top);
			display_menu_row(menu, i + *top, *top, is_curs, row + i, col,
							loc->width);
		}
	}

	if (menu->cursor >= 0)
		Term_gotoxy(col + menu->cursor_x_offset, row + cursor - *top);
}